

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

int ssl_check_no_sig_alg_duplication(uint16_t *sig_algs)

{
  int local_24;
  ulong uStack_20;
  int ret;
  size_t j;
  size_t i;
  uint16_t *sig_algs_local;
  
  local_24 = 0;
  for (j = 0; sig_algs[j] != 0; j = j + 1) {
    for (uStack_20 = 0; uStack_20 < j; uStack_20 = uStack_20 + 1) {
      if (sig_algs[j] == sig_algs[uStack_20]) {
        printf(" entry(%04x,%zu) is duplicated at %zu\n",(ulong)sig_algs[j],uStack_20,j);
        local_24 = -1;
      }
    }
  }
  return local_24;
}

Assistant:

MBEDTLS_CHECK_RETURN_CRITICAL
static int ssl_check_no_sig_alg_duplication(uint16_t *sig_algs)
{
    size_t i, j;
    int ret = 0;

    for (i = 0; sig_algs[i] != MBEDTLS_TLS_SIG_NONE; i++) {
        for (j = 0; j < i; j++) {
            if (sig_algs[i] != sig_algs[j]) {
                continue;
            }
            mbedtls_printf(" entry(%04x,%" MBEDTLS_PRINTF_SIZET
                           ") is duplicated at %" MBEDTLS_PRINTF_SIZET "\n",
                           sig_algs[i], j, i);
            ret = -1;
        }
    }
    return ret;
}